

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ApiPhraseNext(Fts5Context *pCtx,Fts5PhraseIter *pIter,int *piCol,int *piOff)

{
  long lVar1;
  int iVar2;
  u32 *in_RCX;
  uchar *in_RDX;
  ulong *in_RSI;
  long in_FS_OFFSET;
  int nCol;
  int iVal;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RSI < in_RSI[1]) {
    iVar2 = sqlite3Fts5GetVarint32(in_RDX,in_RCX);
    *in_RSI = *in_RSI + (long)iVar2;
    *in_RCX = *in_RCX + 0xaaaaaaa8;
  }
  else {
    in_RDX[0] = 0xff;
    in_RDX[1] = 0xff;
    in_RDX[2] = 0xff;
    in_RDX[3] = 0xff;
    *in_RCX = 0xffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts5ApiPhraseNext(
  Fts5Context *pCtx,
  Fts5PhraseIter *pIter,
  int *piCol, int *piOff
){
  if( pIter->a>=pIter->b ){
    *piCol = -1;
    *piOff = -1;
  }else{
    int iVal;
    pIter->a += fts5GetVarint32(pIter->a, iVal);
    if( iVal==1 ){
      /* Avoid returning a (*piCol) value that is too large for the table,
      ** even if the position-list is corrupt. The caller might not be
      ** expecting it.  */
      int nCol = ((Fts5Table*)(((Fts5Cursor*)pCtx)->base.pVtab))->pConfig->nCol;
      pIter->a += fts5GetVarint32(pIter->a, iVal);
      *piCol = (iVal>=nCol ? nCol-1 : iVal);
      *piOff = 0;
      pIter->a += fts5GetVarint32(pIter->a, iVal);
    }
    *piOff += (iVal-2);
  }
}